

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,BuiltIn builtin,StorageClass storage)

{
  uint32_t id;
  CompilerError *this_00;
  string *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_78;
  allocator local_77;
  allocator local_76;
  allocator local_75;
  uint32_t local_74;
  spirv_cross local_70 [39];
  undefined1 local_49;
  SPIRType *local_48;
  SPIRType *type;
  SPIRVariable *var;
  allocator local_21;
  StorageClass local_20;
  BuiltIn local_1c;
  StorageClass storage_local;
  BuiltIn builtin_local;
  CompilerHLSL *this_local;
  string *ret;
  
  local_20 = storage;
  local_1c = builtin;
  _storage_local = this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  switch(builtin) {
  case BuiltInVertexId:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"gl_VertexID",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case BuiltInInstanceId:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"gl_InstanceID",(allocator *)((long)&var + 3));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var + 3));
    break;
  default:
    CompilerGLSL::builtin_to_glsl_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,builtin,storage);
    break;
  case BuiltInPointCoord:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"float2(0.5f, 0.5f)",&local_75);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_75);
    break;
  case BuiltInHelperInvocation:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"IsHelperLane()",&local_78);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_78);
    break;
  case BuiltInNumWorkgroups:
    if (this->num_workgroups_builtin == 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "NumWorkgroups builtin is used, but remap_num_workgroups_builtin() was not called. Cannot emit code for this builtin."
                );
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    type = (SPIRType *)
           Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,this->num_workgroups_builtin);
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
    local_48 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
    local_49 = 0;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_70,this,(ulong)this->num_workgroups_builtin,1);
    local_74 = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(local_48->super_IVariant).self);
    ts_1 = Compiler::get_member_name_abi_cxx11_((Compiler *)this,(TypeID)local_74,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&>
              (__return_storage_ptr__,local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x597e50,
               (char (*) [2])ts_1,in_R8);
    ::std::__cxx11::string::~string((string *)local_70);
    ParsedIR::sanitize_underscores(__return_storage_ptr__);
    break;
  case BuiltInSubgroupSize:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"WaveGetLaneCount()",&local_77);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_77);
    break;
  case BuiltInSubgroupLocalInvocationId:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"WaveGetLaneIndex()",&local_76);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_76);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::builtin_to_glsl(spv::BuiltIn builtin, spv::StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInVertexId:
		return "gl_VertexID";
	case BuiltInInstanceId:
		return "gl_InstanceID";
	case BuiltInNumWorkgroups:
	{
		if (!num_workgroups_builtin)
			SPIRV_CROSS_THROW("NumWorkgroups builtin is used, but remap_num_workgroups_builtin() was not called. "
			                  "Cannot emit code for this builtin.");

		auto &var = get<SPIRVariable>(num_workgroups_builtin);
		auto &type = get<SPIRType>(var.basetype);
		auto ret = join(to_name(num_workgroups_builtin), "_", get_member_name(type.self, 0));
		ParsedIR::sanitize_underscores(ret);
		return ret;
	}
	case BuiltInPointCoord:
		// Crude hack, but there is no real alternative. This path is only enabled if point_coord_compat is set.
		return "float2(0.5f, 0.5f)";
	case BuiltInSubgroupLocalInvocationId:
		return "WaveGetLaneIndex()";
	case BuiltInSubgroupSize:
		return "WaveGetLaneCount()";
	case BuiltInHelperInvocation:
		return "IsHelperLane()";

	default:
		return CompilerGLSL::builtin_to_glsl(builtin, storage);
	}
}